

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall ArgTest_PointerArg_Test::TestBody(ArgTest_PointerArg_Test *this)

{
  StrictMock<mock_visitor<const_void_*>_> *pSVar1;
  StrictMock<mock_visitor<const_void_*>_> visitor_3;
  StrictMock<mock_visitor<const_void_*>_> visitor_2;
  Type expected;
  StrictMock<mock_visitor<const_void_*>_> visitor_1;
  StrictMock<mock_visitor<const_void_*>_> visitor;
  void *cp;
  void *p;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *in_stack_fffffffffffffb58;
  StrictMock<mock_visitor<const_void_*>_> *in_stack_fffffffffffffb60;
  StrictMock<mock_visitor<const_void_*>_> *in_stack_fffffffffffffb80;
  undefined1 *value;
  Matcher<const_void_*> *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc64;
  char *in_stack_fffffffffffffc68;
  MockSpec<test_result_(const_void_*)> *in_stack_fffffffffffffc70;
  undefined1 local_d8 [192];
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_18 = 0;
  testing::StrictMock<mock_visitor<const_void_*>_>::StrictMock(in_stack_fffffffffffffb80);
  value = local_d8;
  testing::Matcher<const_void_*>::Matcher(in_stack_fffffffffffffba0,value);
  mock_visitor<const_void_*>::gmock_visit
            ((mock_visitor<const_void_*> *)in_stack_fffffffffffffb60,
             (Matcher<const_void_*> *)in_stack_fffffffffffffb58);
  testing::internal::MockSpec<test_result_(const_void_*)>::InternalExpectedAt
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc64,
             in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  testing::Matcher<const_void_*>::~Matcher((Matcher<const_void_*> *)0x121ef4);
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
            (&in_stack_fffffffffffffb60->_vptr_StrictMock);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<void_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (in_stack_fffffffffffffb60,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)in_stack_fffffffffffffb58);
  testing::StrictMock<mock_visitor<const_void_*>_>::~StrictMock(in_stack_fffffffffffffb60);
  testing::StrictMock<mock_visitor<const_void_*>_>::StrictMock(in_stack_fffffffffffffb80);
  testing::Matcher<const_void_*>::Matcher(in_stack_fffffffffffffba0,value);
  pSVar1 = (StrictMock<mock_visitor<const_void_*>_> *)
           mock_visitor<const_void_*>::gmock_visit
                     ((mock_visitor<const_void_*> *)in_stack_fffffffffffffb60,
                      (Matcher<const_void_*> *)in_stack_fffffffffffffb58);
  testing::internal::MockSpec<test_result_(const_void_*)>::InternalExpectedAt
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc64,
             in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  testing::Matcher<const_void_*>::~Matcher((Matcher<const_void_*> *)0x121fac);
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,void*>
            (&in_stack_fffffffffffffb60->_vptr_StrictMock);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<void_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  testing::StrictMock<mock_visitor<const_void_*>_>::~StrictMock(in_stack_fffffffffffffb60);
  testing::StrictMock<mock_visitor<const_void_*>_>::StrictMock(pSVar1);
  testing::Matcher<const_void_*>::Matcher(in_stack_fffffffffffffba0,value);
  mock_visitor<const_void_*>::gmock_visit
            ((mock_visitor<const_void_*> *)in_stack_fffffffffffffb60,
             (Matcher<const_void_*> *)in_stack_fffffffffffffb58);
  testing::internal::MockSpec<test_result_(const_void_*)>::InternalExpectedAt
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc64,
             in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  testing::Matcher<const_void_*>::~Matcher((Matcher<const_void_*> *)0x122074);
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void_const*>
            (&in_stack_fffffffffffffb60->_vptr_StrictMock);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<void_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (in_stack_fffffffffffffb60,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)in_stack_fffffffffffffb58);
  testing::StrictMock<mock_visitor<const_void_*>_>::~StrictMock(in_stack_fffffffffffffb60);
  testing::StrictMock<mock_visitor<const_void_*>_>::StrictMock(pSVar1);
  testing::Matcher<const_void_*>::Matcher(in_stack_fffffffffffffba0,value);
  pSVar1 = (StrictMock<mock_visitor<const_void_*>_> *)
           mock_visitor<const_void_*>::gmock_visit
                     ((mock_visitor<const_void_*> *)in_stack_fffffffffffffb60,
                      (Matcher<const_void_*> *)in_stack_fffffffffffffb58);
  testing::internal::MockSpec<test_result_(const_void_*)>::InternalExpectedAt
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc64,
             in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  testing::Matcher<const_void_*>::~Matcher((Matcher<const_void_*> *)0x122123);
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,void_const*>
            (&pSVar1->_vptr_StrictMock);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<void_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (pSVar1,in_stack_fffffffffffffb58);
  testing::StrictMock<mock_visitor<const_void_*>_>::~StrictMock(pSVar1);
  return;
}

Assistant:

TEST(ArgTest, PointerArg) {
  void *p = FMT_NULL;
  const void *cp = FMT_NULL;
  CHECK_ARG_(char, cp, p);
  CHECK_ARG_(wchar_t, cp, p);
  CHECK_ARG(cp, );
}